

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O2

void __thiscall
boost::runtime::
argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
::produce_argument(argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                   *this,cstring *source,cstring *param_name,arguments_store *store)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator_type local_a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  cstring local_68;
  cstring local_58;
  cstring local_48;
  cstring local_38;
  cstring local_28;
  
  local_28.m_begin = param_name->m_begin;
  local_28.m_end = param_name->m_end;
  local_38.m_begin = source->m_begin;
  local_38.m_end = source->m_end;
  value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::interpret(&value,(value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)this,&local_28,&local_38);
  local_48.m_begin = param_name->m_begin;
  local_48.m_end = param_name->m_end;
  bVar1 = arguments_store::has(store,&local_48);
  if (bVar1) {
    local_58.m_begin = param_name->m_begin;
    local_58.m_end = param_name->m_end;
    this_00 = arguments_store::
              get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (store,&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&value);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&values,1,&value,&local_a1);
    local_68.m_begin = param_name->m_begin;
    local_68.m_end = param_name->m_end;
    arguments_store::set<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (store,&local_68,&values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&values);
  }
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void        produce_argument( cstring source, cstring param_name, arguments_store& store ) const
    {
        ValueType value = m_interpreter.interpret( param_name, source );

        if( store.has( param_name ) ) {
            std::vector<ValueType>& values = store.get<std::vector<ValueType> >( param_name );
            values.push_back( value );
        }
        else {
            std::vector<ValueType> values( 1, value );

            store.set( param_name, values );
        }

    }